

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O2

void Acb_NtkOpt(Acb_Ntk_t *pNtk,Acb_Par_t *pPars)

{
  uint *puVar1;
  Acb_Par_t *pAVar2;
  Vec_Que_t *pVVar3;
  float *pfVar4;
  int *piVar5;
  Acb_ObjType_t AVar6;
  int iVar7;
  int iVar8;
  Acb_Mfs_t *p;
  int *piVar9;
  Vec_Int_t *p_00;
  void *__s;
  abctime aVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  size_t __size;
  ulong uVar15;
  char *pcVar16;
  uint uVar17;
  float fVar18;
  float fVar19;
  double dVar20;
  float fVar21;
  double dVar22;
  
  p = Acb_MfsStart(pNtk,pPars);
  if (pPars->fVerbose != 0) {
    pAVar2 = p->pPars;
    pcVar16 = "Area";
    if (pAVar2->fArea == 0) {
      pcVar16 = "Delay";
    }
    printf("%s-optimization parameters: TfiLev(I) = %d  TfoLev(O) = %d  WinMax(W) = %d  LutSize = %d\n"
           ,pcVar16,(ulong)(uint)pAVar2->nTfiLevMax,(ulong)(uint)pAVar2->nTfoLevMax,
           (ulong)(uint)pAVar2->nWinNodeMax,(ulong)(uint)pAVar2->nLutSize);
  }
  Vec_WecInit(&pNtk->vFanouts,(pNtk->vObjType).nCap);
  for (iVar13 = 1; iVar13 < (pNtk->vObjType).nSize; iVar13 = iVar13 + 1) {
    AVar6 = Acb_ObjType(pNtk,iVar13);
    if (AVar6 != ABC_OPER_NONE) {
      piVar9 = Acb_ObjFanins(pNtk,iVar13);
      for (lVar12 = 0; lVar12 < *piVar9; lVar12 = lVar12 + 1) {
        p_00 = Vec_WecEntry(&pNtk->vFanouts,piVar9[lVar12 + 1]);
        Vec_IntPush(p_00,iVar13);
      }
    }
  }
  Vec_IntFill(&pNtk->vObjFunc,(pNtk->vObjType).nCap,-1);
  Vec_WecInit(&pNtk->vCnfs,(pNtk->vObjType).nCap);
  if (p->pPars->fArea == 0) {
    Acb_NtkUpdateTiming(pNtk,-1);
    while( true ) {
      pVVar3 = pNtk->vQue;
      if (pVVar3->nSize < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecQue.h"
                      ,0x88,"int Vec_QueSize(Vec_Que_t *)");
      }
      if (pVVar3->nSize == 1) break;
      piVar9 = pVVar3->pHeap;
      iVar13 = piVar9[1];
      pfVar4 = *pVVar3->pCostsFlt;
      if (pfVar4 == (float *)0x0) {
        fVar18 = (float)iVar13;
      }
      else {
        fVar18 = pfVar4[iVar13];
      }
      if ((int)fVar18 < 1) break;
      piVar5 = pVVar3->pOrder;
      piVar5[iVar13] = -1;
      iVar8 = pVVar3->nSize;
      pVVar3->nSize = iVar8 + -1;
      if (iVar8 + -1 == 1) {
        piVar9[1] = -1;
      }
      else {
        iVar7 = piVar9[(long)iVar8 + -1];
        piVar9[(long)iVar8 + -1] = -1;
        piVar9[1] = iVar7;
        piVar5[iVar7] = 1;
        if (pfVar4 == (float *)0x0) {
          fVar18 = (float)iVar7;
        }
        else {
          fVar18 = pfVar4[iVar7];
        }
        uVar17 = 1;
        while( true ) {
          uVar14 = uVar17 * 2;
          iVar8 = pVVar3->nSize;
          if (iVar8 <= (int)uVar14) break;
          uVar11 = uVar14 | 1;
          if ((int)uVar11 < iVar8) {
            if (pfVar4 == (float *)0x0) {
              fVar19 = (float)piVar9[(int)uVar14];
              fVar21 = (float)piVar9[(int)uVar11];
            }
            else {
              fVar19 = pfVar4[piVar9[(int)uVar14]];
              fVar21 = pfVar4[piVar9[(int)uVar11]];
            }
            if (fVar19 < fVar21) {
              uVar14 = uVar11;
            }
          }
          if (iVar8 <= (int)uVar14) {
            __assert_fail("child < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecQue.h"
                          ,0xbc,"void Vec_QueMoveDown(Vec_Que_t *, int)");
          }
          iVar8 = piVar9[(int)uVar14];
          if (pfVar4 == (float *)0x0) {
            fVar19 = (float)iVar8;
          }
          else {
            fVar19 = pfVar4[iVar8];
          }
          if (fVar19 <= fVar18) break;
          piVar9[(int)uVar17] = iVar8;
          piVar5[iVar8] = uVar17;
          uVar17 = uVar14;
        }
        piVar9[(int)uVar17] = iVar7;
        piVar5[iVar7] = uVar17;
      }
      AVar6 = Acb_ObjType(pNtk,iVar13);
      if (AVar6 != ABC_OPER_NONE) {
        Acb_NtkOptNode(p,iVar13);
      }
    }
  }
  else {
    uVar17 = (pNtk->vObjType).nSize;
    iVar13 = (((int)uVar17 >> 5) + 1) - (uint)((uVar17 & 0x1f) == 0);
    if (iVar13 == 0) {
      __size = 0;
      __s = (void *)0x0;
    }
    else {
      __size = (long)iVar13 << 2;
      __s = malloc(__size);
    }
    memset(__s,0,__size);
    Acb_NtkUpdateLevelD(pNtk,-1);
    for (iVar8 = 2; -1 < iVar8; iVar8 = iVar8 + -1) {
      uVar15 = 1;
      while (uVar14 = (uint)uVar15, (int)uVar14 < (pNtk->vObjType).nSize) {
        AVar6 = Acb_ObjType(pNtk,uVar14);
        if (AVar6 != ABC_OPER_NONE) {
          iVar7 = Acb_ObjIsCio(pNtk,uVar14);
          if (((int)uVar14 < (int)uVar17) && (iVar7 == 0)) {
            if (iVar13 * 0x20 <= (int)uVar14) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecBit.h"
                            ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
            }
            if ((*(uint *)((long)__s + (uVar15 >> 5) * 4) >> (uVar14 & 0x1f) & 1) == 0) {
              iVar7 = Acb_NtkObjMffcEstimate(pNtk,uVar14);
              if (iVar8 <= iVar7) {
                p->nNodes = p->nNodes + 1;
                do {
                  iVar7 = Acb_NtkOptNode(p,uVar14);
                  if (iVar7 == 0) break;
                  iVar7 = Acb_ObjFaninNum(pNtk,uVar14);
                } while (iVar7 != 0);
                puVar1 = (uint *)((long)__s + (uVar15 >> 5) * 4);
                *puVar1 = *puVar1 | 1 << ((byte)uVar15 & 0x1f);
              }
            }
          }
        }
        uVar15 = (ulong)(uVar14 + 1);
      }
    }
    free(__s);
  }
  if (pPars->fVerbose != 0) {
    aVar10 = Abc_Clock();
    p->timeTotal = aVar10 - p->timeTotal;
    uVar17 = p->nWins;
    uVar14 = 1;
    if (1 < (int)uVar17) {
      uVar14 = uVar17;
    }
    iVar13 = 0x7a013c;
    printf("Node = %d  Win = %d (Ave = %d)  DivAve = %d   Change = %d  C = %d  N1 = %d  N2 = %d  N3 = %d   Over = %d  Str = %d  2Node = %d.\n"
           ,(ulong)(uint)p->nNodes,(ulong)uVar17,(long)p->nWinsAll / (long)(int)uVar14 & 0xffffffff,
           (long)p->nDivsAll / (long)(int)uVar14 & 0xffffffff,
           (ulong)(uint)(p->nChanges[2] + p->nChanges[3] + p->nChanges[1] + p->nChanges[0]),
           (ulong)(uint)p->nChanges[0],(ulong)(uint)p->nChanges[1],(ulong)(uint)p->nChanges[2],
           (ulong)(uint)p->nChanges[3],(ulong)(uint)p->nOvers,(ulong)(uint)StrCount,
           (ulong)(uint)p->nTwoNodes);
    Abc_Print(iVar13,"%s =","Windowing  ");
    dVar20 = 0.0;
    if (p->timeTotal != 0) {
      dVar20 = ((double)p->timeWin * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar13,"%9.2f sec (%6.2f %%)\n",(double)p->timeWin / 1000000.0,dVar20);
    Abc_Print(iVar13,"%s =","CNF compute");
    dVar20 = 0.0;
    if (p->timeTotal != 0) {
      dVar20 = ((double)p->timeCnf * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar13,"%9.2f sec (%6.2f %%)\n",(double)p->timeCnf / 1000000.0,dVar20);
    Abc_Print(iVar13,"%s =","Make solver");
    dVar20 = 0.0;
    if (p->timeTotal != 0) {
      dVar20 = ((double)p->timeSol * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar13,"%9.2f sec (%6.2f %%)\n",(double)p->timeSol / 1000000.0,dVar20);
    Abc_Print(iVar13,"%s =","SAT solving");
    dVar20 = 0.0;
    if (p->timeTotal != 0) {
      dVar20 = ((double)p->timeSat * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar13,"%9.2f sec (%6.2f %%)\n",(double)p->timeSat / 1000000.0,dVar20);
    Abc_Print(iVar13,"%s =","TOTAL      ");
    dVar20 = (double)p->timeTotal;
    dVar22 = 0.0;
    if (p->timeTotal != 0) {
      dVar22 = (dVar20 * 100.0) / dVar20;
    }
    Abc_Print(iVar13,"%9.2f sec (%6.2f %%)\n",dVar20 / 1000000.0,dVar22);
    fflush(_stdout);
  }
  Acb_MfsStop(p);
  StrCount = 0;
  return;
}

Assistant:

void Acb_NtkOpt( Acb_Ntk_t * pNtk, Acb_Par_t * pPars )
{
    Acb_Mfs_t * pMan = Acb_MfsStart( pNtk, pPars );
    if ( pPars->fVerbose )
        printf( "%s-optimization parameters: TfiLev(I) = %d  TfoLev(O) = %d  WinMax(W) = %d  LutSize = %d\n", 
            pMan->pPars->fArea ? "Area" : "Delay", pMan->pPars->nTfiLevMax, pMan->pPars->nTfoLevMax, pMan->pPars->nWinNodeMax, pMan->pPars->nLutSize );
    Acb_NtkCreateFanout( pNtk );  // fanout data structure
    Acb_NtkCleanObjFuncs( pNtk ); // SAT variables
    Acb_NtkCleanObjCnfs( pNtk );  // CNF representations
    if ( pMan->pPars->fArea )
    {
        int n = 0, iObj, RetValue, nNodes = Acb_NtkObjNumMax(pNtk);
        Vec_Bit_t * vVisited = Vec_BitStart( Acb_NtkObjNumMax(pNtk) );
        Acb_NtkUpdateLevelD( pNtk, -1 ); // compute forward logic level
        for ( n = 2; n >= 0; n-- )
            Acb_NtkForEachNode( pNtk, iObj )
                if ( iObj < nNodes && !Vec_BitEntry(vVisited, iObj) && Acb_NtkObjMffcEstimate(pNtk, iObj) >= n )
                {
                    pMan->nNodes++;
                    //if ( iObj != 103 )
                    //    continue;
                    //Acb_NtkOptNode( pMan, iObj );
                    while ( (RetValue = Acb_NtkOptNode(pMan, iObj)) && Acb_ObjFaninNum(pNtk, iObj) );                    
                    Vec_BitWriteEntry( vVisited, iObj, 1 );
                }
        Vec_BitFree( vVisited );
    }
    else
    {
        int Value;
        Acb_NtkUpdateTiming( pNtk, -1 ); // compute delay information
        while ( (Value = (int)Vec_QueTopPriority(pNtk->vQue)) > 0 )
        {
            int iObj = Vec_QuePop(pNtk->vQue);
            if ( !Acb_ObjType(pNtk, iObj) )
                continue;
            //if ( iObj != 103 )
            //    continue;
            //printf( "Trying node %4d (%4d) ", iObj, Value );
            Acb_NtkOptNode( pMan, iObj ); 
        }
    }
    if ( pPars->fVerbose )
    {
        pMan->timeTotal = Abc_Clock() - pMan->timeTotal;
        printf( "Node = %d  Win = %d (Ave = %d)  DivAve = %d   Change = %d  C = %d  N1 = %d  N2 = %d  N3 = %d   Over = %d  Str = %d  2Node = %d.\n", 
            pMan->nNodes, pMan->nWins, pMan->nWinsAll/Abc_MaxInt(1, pMan->nWins), pMan->nDivsAll/Abc_MaxInt(1, pMan->nWins),
            pMan->nChanges[0] + pMan->nChanges[1] + pMan->nChanges[2] + pMan->nChanges[3],
            pMan->nChanges[0], pMan->nChanges[1], pMan->nChanges[2], pMan->nChanges[3], pMan->nOvers, StrCount, pMan->nTwoNodes );
        ABC_PRTP( "Windowing  ", pMan->timeWin,    pMan->timeTotal );
        ABC_PRTP( "CNF compute", pMan->timeCnf,    pMan->timeTotal );
        ABC_PRTP( "Make solver", pMan->timeSol,    pMan->timeTotal );
        ABC_PRTP( "SAT solving", pMan->timeSat,    pMan->timeTotal );
//        ABC_PRTP( "  unsat    ", pMan->timeSatU,   pMan->timeTotal );
//        ABC_PRTP( "  sat      ", pMan->timeSatS,   pMan->timeTotal );
        ABC_PRTP( "TOTAL      ", pMan->timeTotal,  pMan->timeTotal );
        fflush( stdout );
    }
    Acb_MfsStop( pMan );
    StrCount = 0;
}